

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFunctionLibrary.cpp
# Opt level: O0

deFunctionPtr __thiscall
tcu::StaticFunctionLibrary::getFunction(StaticFunctionLibrary *this,char *funcName)

{
  bool bVar1;
  pointer ppVar2;
  _Self local_68 [3];
  allocator<char> local_49;
  key_type local_48;
  _Self local_28;
  const_iterator iter;
  char *funcName_local;
  StaticFunctionLibrary *this_local;
  
  iter._M_node = (_Base_ptr)funcName;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,funcName,&local_49);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)()>_>_>
       ::find(&this->m_functions,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  local_68[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)()>_>_>
       ::end(&this->m_functions);
  bVar1 = std::operator==(&local_28,local_68);
  if (bVar1) {
    this_local = (StaticFunctionLibrary *)0x0;
  }
  else {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)()>_>
             ::operator->(&local_28);
    this_local = (StaticFunctionLibrary *)ppVar2->second;
  }
  return (deFunctionPtr)this_local;
}

Assistant:

deFunctionPtr StaticFunctionLibrary::getFunction (const char* funcName) const
{
	std::map<std::string, deFunctionPtr>::const_iterator iter = m_functions.find(funcName);

	if (iter == m_functions.end())
		return DE_NULL;
	else
		return iter->second;
}